

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

ssize_t __thiscall r_code::SysView::write(SysView *this,int __fd,void *__buf,size_t __n)

{
  Atom *pAVar1;
  uint *puVar2;
  pointer puVar3;
  undefined4 in_register_00000034;
  undefined4 *puVar4;
  pointer i;
  ulong i_00;
  
  puVar4 = (undefined4 *)CONCAT44(in_register_00000034,__fd);
  *puVar4 = (int)((ulong)((long)(this->super_ImageObject).code.m_vector.
                                super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ImageObject).code.m_vector.
                               super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  puVar4[1] = (int)((ulong)((long)(this->super_ImageObject).references.m_vector.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->super_ImageObject).references.m_vector.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((this->super_ImageObject).code.m_vector.
      super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->super_ImageObject).code.m_vector.
      super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
      super__Vector_impl_data._M_start) {
    i_00 = 0;
  }
  else {
    i_00 = 0;
    do {
      pAVar1 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,i_00);
      puVar4[i_00 + 2] = pAVar1->atom;
      i_00 = i_00 + 1;
    } while (i_00 < (ulong)((long)(this->super_ImageObject).code.m_vector.
                                  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->super_ImageObject).code.m_vector.
                                  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  puVar3 = (this->super_ImageObject).references.m_vector.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 != (this->super_ImageObject).references.m_vector.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start) {
    i = (pointer)0x0;
    do {
      puVar2 = vector<unsigned_int>::operator[](&(this->super_ImageObject).references,(size_t)i);
      puVar4[(long)i + i_00 + 2] = *puVar2;
      i = (pointer)((long)i + 1);
      puVar3 = (pointer)((long)(this->super_ImageObject).references.m_vector.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ImageObject).references.m_vector.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2);
    } while (i < puVar3);
  }
  return (ssize_t)puVar3;
}

Assistant:

void SysView::write(uint32_t *data)
{
    data[0] = code.size();
    data[1] = references.size();
    size_t i = 0;

    for (; i < code.size(); ++i) {
        data[2 + i] = code[i].atom;
    }

    for (size_t j = 0; j < references.size(); ++j) {
        data[2 + i + j] = references[j];
    }
}